

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

int __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
::GetCachedSize(MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  uint uVar6;
  
  iVar4 = 0;
  iVar3 = 0;
  if ((this->_has_bits_[0] & 1) != 0) {
    iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    uVar1 = *(uint *)(CONCAT44(extraout_var,iVar3) + 8);
    uVar6 = uVar1 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    iVar3 = uVar1 + (iVar3 * 9 + 0x49U >> 6) + 1;
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    iVar4 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    uVar5 = *(ulong *)CONCAT44(extraout_var_00,iVar4) | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar4 = ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  return iVar4 + iVar3;
}

Assistant:

int GetCachedSize() const {
    int size = 0;
    size += has_key()
        ? kTagSize + KeyTypeHandler::GetCachedSize(key())
        : 0;
    size += has_value()
        ? kTagSize + ValueTypeHandler::GetCachedSize(
            value())
        : 0;
    return size;
  }